

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

DdNode * cuddHashTableLookup2(DdHashTable *hash,DdNode *f,DdNode *g)

{
  ptrint *ppVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  DdHashItem **ppDVar5;
  DdNode *pDVar6;
  int iVar7;
  DdHashItem *pDVar8;
  DdHashItem *pDVar9;
  DdHashItem *pDVar10;
  
  iVar3 = *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20);
  iVar4 = *(int *)(((ulong)g & 0xfffffffffffffffe) + 0x20);
  iVar7 = hash->shift;
  ppDVar5 = hash->bucket;
  pDVar9 = (DdHashItem *)(DdHashItem **)0x0;
  pDVar10 = (DdHashItem *)
            (ppDVar5 +
            ((((uint)g & 1) + iVar4 * 2 + (((uint)f & 1) + iVar3 * 2) * 0xc00005) * 0x40f1f9 >>
            ((byte)iVar7 & 0x1f)));
  do {
    pDVar8 = pDVar9;
    pDVar10 = pDVar10->next;
    if (pDVar10 == (DdHashItem *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar9 = pDVar10;
  } while ((pDVar10->key[0] != f) || ((DdNode *)pDVar10[1].next != g));
  pDVar6 = pDVar10->value;
  ppVar1 = &pDVar10->count;
  *ppVar1 = *ppVar1 + -1;
  if (*ppVar1 != 0) {
    return pDVar6;
  }
  piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
  *piVar2 = *piVar2 + -1;
  pDVar9 = (DdHashItem *)
           (ppDVar5 +
           ((((uint)g & 1) + iVar4 * 2 + (((uint)f & 1) + iVar3 * 2) * 0xc00005) * 0x40f1f9 >>
           ((byte)iVar7 & 0x1f)));
  if (pDVar8 != (DdHashItem *)0x0) {
    pDVar9 = pDVar8;
  }
  pDVar9->next = pDVar10->next;
  pDVar10->next = hash->nextFree;
  hash->nextFree = pDVar10;
  hash->size = hash->size - 1;
  return pDVar6;
}

Assistant:

DdNode *
cuddHashTableLookup2(
  DdHashTable * hash,
  DdNode * f,
  DdNode * g)
{
    unsigned int posn;
    DdHashItem *item, *prev;

#ifdef DD_DEBUG
    assert(hash->keysize == 2);
#endif

    posn = ddLCHash2(cuddF2L(f),cuddF2L(g),hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    while (item != NULL) {
        DdNodePtr *key = item->key;
        if ((f == key[0]) && (g == key[1])) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}